

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cesl_format.c
# Opt level: O3

cesl_format_t * cesl_format_ui(cesl_format_t *self,uint value)

{
  size_t sVar1;
  
  if (self->cur_pos + 0xd < self->buf_max_size) {
    sVar1 = cesl_uint_to_str(value,self->buf + self->cur_pos,'\n');
    self->cur_pos = self->cur_pos + sVar1;
  }
  else {
    self->error_code = 1;
  }
  return self;
}

Assistant:

cesl_format_t *cesl_format_ui(cesl_format_t *self, unsigned int value)
{
    const size_t min_required_size = (sizeof(unsigned int) * 8) / 3 + 3; // 1 for rounding, 1 for sign, 1 for '\0'

    if (self->cur_pos + min_required_size >= self->buf_max_size) {
        self->error_code = cesl_format_buffer_full_error;
        return self;
    }
    self->cur_pos += cesl_uint_to_str (value, &(self->buf[self->cur_pos]), 10);
    return self;
}